

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::HlslParseContext::expandArguments
          (HlslParseContext *this,TSourceLoc *loc,TFunction *function,TIntermTyped **arguments)

{
  void *__dest;
  TType *type;
  undefined8 *puVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermTyped *pTVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar9;
  long *plVar10;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TIntermAggregate *left;
  long lVar11;
  undefined4 extraout_var_08;
  vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *pvVar17;
  TIntermTyped **ppTVar12;
  void *pvVar13;
  undefined8 *puVar14;
  int iVar15;
  ulong uVar16;
  void *__src;
  TVector<glslang::TIntermTyped_*> memberArgs;
  TIntermAggregate *aggregate;
  TPoolAllocator *local_68;
  undefined8 *puStack_60;
  undefined8 *local_58;
  undefined8 uStack_50;
  TSourceLoc *local_48;
  TIntermTyped *local_40;
  TIntermAggregate *local_38;
  TIntermAggregate *pTVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_04;
  undefined4 extraout_var_07;
  
  local_48 = loc;
  iVar4 = (*((*arguments)->super_TIntermNode)._vptr_TIntermNode[6])();
  pTVar7 = (TIntermAggregate *)CONCAT44(extraout_var,iVar4);
  local_38 = pTVar7;
  iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
  if (0 < iVar4) {
    uVar16 = 0;
    iVar4 = 0;
    do {
      iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      iVar15 = (int)uVar16;
      if ((iVar5 == 1) || (pTVar7 == (TIntermAggregate *)0x0)) {
        pTVar8 = *arguments;
      }
      else {
        iVar5 = (*(pTVar7->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(pTVar7);
        pTVar8 = *(TIntermTyped **)
                  (*(long *)(CONCAT44(extraout_var_00,iVar5) + 8) + (long)(iVar4 + iVar15) * 8);
      }
      iVar5 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[3])();
      pTVar8 = (TIntermTyped *)CONCAT44(extraout_var_01,iVar5);
      bVar2 = wasFlattened(this,pTVar8);
      if (bVar2) {
        iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar16);
        type = *(TType **)(CONCAT44(extraout_var_02,iVar5) + 8);
        iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar16);
        lVar9 = (**(code **)(**(long **)(CONCAT44(extraout_var_03,iVar5) + 8) + 0x50))();
        bVar2 = shouldFlatten(this,type,*(TStorageQualifier *)(lVar9 + 8) & 0x7f,true);
        if (bVar2) {
          local_58 = (undefined8 *)0x0;
          uStack_50 = 0;
          local_68 = (TPoolAllocator *)0x0;
          puStack_60 = (undefined8 *)0x0;
          local_68 = GetThreadPoolAllocator();
          puStack_60 = (undefined8 *)0x0;
          local_58 = (undefined8 *)0x0;
          uStack_50 = 0;
          iVar5 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar8);
          plVar10 = (long *)CONCAT44(extraout_var_04,iVar5);
          cVar3 = (**(code **)(*plVar10 + 0x128))(plVar10);
          if (cVar3 == '\0') {
LAB_0038ed18:
            __assert_fail("isStruct()",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                          ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
          }
          iVar5 = 0;
          while (iVar5 < (int)((ulong)(*(long *)(plVar10[0xd] + 0x10) - *(long *)(plVar10[0xd] + 8))
                              >> 5)) {
            local_40 = flattenAccess(this,pTVar8,iVar5);
            std::vector<glslang::TIntermTyped*,glslang::pool_allocator<glslang::TIntermTyped*>>::
            emplace_back<glslang::TIntermTyped*>
                      ((vector<glslang::TIntermTyped*,glslang::pool_allocator<glslang::TIntermTyped*>>
                        *)&local_68,&local_40);
            iVar5 = iVar5 + 1;
            iVar6 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar8);
            plVar10 = (long *)CONCAT44(extraout_var_05,iVar6);
            cVar3 = (**(code **)(*plVar10 + 0x128))(plVar10);
            if (cVar3 == '\0') goto LAB_0038ed18;
          }
          iVar5 = iVar4 + iVar15;
          if ((long)local_58 - (long)puStack_60 == 8) {
            pTVar8 = (TIntermTyped *)*puStack_60;
            iVar6 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
            ppTVar12 = arguments;
            if ((pTVar7 != (TIntermAggregate *)0x0) && (iVar6 + iVar4 != 1)) {
              iVar6 = (*(pTVar7->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                        _vptr_TIntermNode[0x32])();
              ppTVar12 = (TIntermTyped **)
                         ((long)iVar5 * 8 + *(long *)(CONCAT44(extraout_var_06,iVar6) + 8));
            }
            *ppTVar12 = pTVar8;
          }
          else if (8 < (ulong)((long)local_58 - (long)puStack_60)) {
            iVar6 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
            if (iVar6 + iVar4 == 1) {
              left = TIntermediate::makeAggregate
                               ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                (TIntermNode *)*puStack_60);
              puVar1 = local_58;
              *arguments = (TIntermTyped *)left;
              puVar14 = puStack_60;
              while (puVar14 = puVar14 + 1, puVar14 != puVar1) {
                left = TIntermediate::growAggregate
                                 ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                  (TIntermNode *)left,(TIntermNode *)*puVar14);
                *arguments = (TIntermTyped *)left;
              }
            }
            else {
              iVar6 = (*(pTVar7->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                        _vptr_TIntermNode[0x32])(pTVar7);
              lVar11 = CONCAT44(extraout_var_07,iVar6);
              iVar6 = (*(pTVar7->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                        _vptr_TIntermNode[0x32])(pTVar7);
              lVar9 = *(long *)(CONCAT44(extraout_var_08,iVar6) + 8);
              __dest = (void *)(lVar9 + (long)iVar5 * 8);
              __src = (void *)(lVar9 + (long)iVar5 * 8 + 8);
              pvVar13 = *(void **)(lVar11 + 0x10);
              if (__src != pvVar13) {
                memmove(__dest,__src,(long)pvVar13 - (long)__src);
                pvVar13 = *(void **)(lVar11 + 0x10);
              }
              *(long *)(lVar11 + 0x10) = (long)pvVar13 + -8;
              pvVar17._0_4_ =
                   (vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                   (*(pTVar7->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                     _vptr_TIntermNode[0x32])(pTVar7);
              std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<glslang::TIntermTyped*const*,std::vector<glslang::TIntermTyped*,glslang::pool_allocator<glslang::TIntermTyped*>>>>
                        (pvVar17._0_4_,__dest,puStack_60,local_58);
            }
            iVar4 = iVar4 + (int)((ulong)((long)local_58 - (long)puStack_60) >> 3) + -1;
          }
        }
      }
      uVar16 = (ulong)(iVar15 + 1U);
      iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    } while ((int)(iVar15 + 1U) < iVar5);
  }
  if (pTVar7 != (TIntermAggregate *)0x0) {
    addStructBuffArguments(this,local_48,&local_38);
  }
  return;
}

Assistant:

void HlslParseContext::expandArguments(const TSourceLoc& loc, const TFunction& function, TIntermTyped*& arguments)
{
    TIntermAggregate* aggregate = arguments->getAsAggregate();
    int functionParamNumberOffset = 0;

    // Replace a single argument with a single argument.
    const auto setArg = [&](int paramNum, TIntermTyped* arg) {
        if (function.getParamCount() + functionParamNumberOffset == 1)
            arguments = arg;
        else {
            if (aggregate == nullptr)
                arguments = arg;
            else
                aggregate->getSequence()[paramNum] = arg;
        }
    };

    // Replace a single argument with a list of arguments
    const auto setArgList = [&](int paramNum, const TVector<TIntermTyped*>& args) {
        if (args.size() == 1)
            setArg(paramNum, args.front());
        else if (args.size() > 1) {
            if (function.getParamCount() + functionParamNumberOffset == 1) {
                arguments = intermediate.makeAggregate(args.front());
                std::for_each(args.begin() + 1, args.end(),
                    [&](TIntermTyped* arg) {
                        arguments = intermediate.growAggregate(arguments, arg);
                    });
            } else {
                auto it = aggregate->getSequence().erase(aggregate->getSequence().begin() + paramNum);
                aggregate->getSequence().insert(it, args.begin(), args.end());
            }
            functionParamNumberOffset += (int)(args.size() - 1);
        }
    };

    // Process each argument's conversion
    for (int param = 0; param < function.getParamCount(); ++param) {
        // At this early point there is a slight ambiguity between whether an aggregate 'arguments'
        // is the single argument itself or its children are the arguments.  Only one argument
        // means take 'arguments' itself as the one argument.
        TIntermTyped* arg = function.getParamCount() == 1
                                   ? arguments->getAsTyped()
                                   : (aggregate ?
                                        aggregate->getSequence()[param + functionParamNumberOffset]->getAsTyped() :
                                        arguments->getAsTyped());

        if (wasFlattened(arg) && shouldFlatten(*function[param].type, function[param].type->getQualifier().storage, true)) {
            // Need to pass the structure members instead of the structure.
            TVector<TIntermTyped*> memberArgs;
            for (int memb = 0; memb < (int)arg->getType().getStruct()->size(); ++memb)
                memberArgs.push_back(flattenAccess(arg, memb));
            setArgList(param + functionParamNumberOffset, memberArgs);
        }
    }

    // TODO: if we need both hidden counter args (below) and struct expansion (above)
    // the two algorithms need to be merged: Each assumes the list starts out 1:1 between
    // parameters and arguments.

    // If any argument is a pass-by-reference struct buffer with an associated counter
    // buffer, we have to add another hidden parameter for that counter.
    if (aggregate)
        addStructBuffArguments(loc, aggregate);
}